

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

int __thiscall
Js::
SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
::Add(SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
      *this,LoopEntryPointInfo **item)

{
  int iVar1;
  AutoCriticalSection local_20;
  AddRemoveLock autoLock;
  
  local_20.cs = this->syncObj;
  CCLock::Enter(&(local_20.cs)->super_CCLock);
  iVar1 = JsUtil::
          List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(&this->
                 super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ,item);
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            typename LockPolicy::AddRemoveLock autoLock(syncObj);
            return __super::Add(item);
        }